

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseExpression(ParseContext *ctx)

{
  LexemeType LVar1;
  Lexeme *pLVar2;
  Lexeme *pLVar3;
  SynBase *node_1;
  SynBase *node;
  ParseContext *ctx_local;
  
  ctx_local = (ParseContext *)ParseStatement(ctx);
  if (ctx_local == (ParseContext *)0x0) {
    ctx_local = (ParseContext *)ParseAssignment(ctx);
    if (ctx_local == (ParseContext *)0x0) {
      ctx_local = (ParseContext *)0x0;
    }
    else {
      LVar1 = ParseContext::Peek(ctx);
      if (LVar1 == lex_none) {
        pLVar2 = ParseContext::Current(ctx);
        pLVar3 = ParseContext::Last(ctx);
        if (pLVar2 != pLVar3) {
          pLVar2 = ParseContext::Current(ctx);
          anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: unknown lexeme");
        }
      }
      anon_unknown.dwarf_104b6::CheckConsume
                (ctx,lex_semicolon,"ERROR: \';\' not found after expression");
    }
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseExpression(ParseContext &ctx)
{
	if(SynBase *node = ParseStatement(ctx))
		return node;

	if(SynBase *node = ParseAssignment(ctx))
	{
		if(ctx.Peek() == lex_none && ctx.Current() != ctx.Last())
			Report(ctx, ctx.Current(), "ERROR: unknown lexeme");

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after expression");

		return node;
	}

	return NULL;
}